

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAEngine.h
# Opt level: O3

void __thiscall
Js::SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
          (SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_> *this,
          uint src,void **dst)

{
  ScriptContext *scriptContext;
  bool bVar1;
  SrcTypeId typeId;
  SCADeepCloneType local_30;
  uint local_2c;
  SCADeepCloneType deepClone;
  uint src_local;
  
  scriptContext =
       (this->m_cloner->
       super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
       ).super_ScriptContextHolder.m_scriptContext;
  local_2c = src;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  typeId = DeserializationCloner<Js::StreamReader>::GetTypeId(this->m_cloner,src);
  bVar1 = DeserializationCloner<Js::StreamReader>::TryClonePrimitive(this->m_cloner,typeId,src,dst);
  if (!bVar1) {
    bVar1 = DeserializationCloner<Js::StreamReader>::TryCloneObject
                      (this->m_cloner,typeId,src,dst,&local_30);
    if (!bVar1) {
      ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)this->m_cloner);
    }
    JsUtil::
    BaseDictionary<unsigned_int,void*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_int,void*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<unsigned_int,void*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->m_clonedObjects,&local_2c,dst);
    if (local_30 != Object) {
      if (local_30 == Set) {
        DeserializationCloner<Js::StreamReader>::CloneSet(this->m_cloner,local_2c,*dst);
      }
      else {
        if (local_30 != Map) {
          return;
        }
        DeserializationCloner<Js::StreamReader>::CloneMap(this->m_cloner,local_2c,*dst);
      }
      local_30 = Object;
    }
    DeserializationCloner<Js::StreamReader>::CloneProperties(this->m_cloner,typeId,local_2c,*dst);
  }
  return;
}

Assistant:

void Clone(Src src, Dst* dst)
        {
            PROBE_STACK(m_cloner->GetScriptContext(), Constants::MinStackDefault);

#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Src>(src);
#endif

            typename Cloner::SrcTypeId typeId = m_cloner->GetTypeId(src);

            if (m_cloner->TryClonePrimitive(typeId, src, dst))
            {
                return;
            }

            if (Cloner::ShouldLookupReference() && TryGetClonedObject(src, dst))
            {
                m_cloner->CloneObjectReference(src, *dst);
                return;
            }

            SCADeepCloneType deepClone;
            if (m_cloner->TryCloneObject(typeId, src, dst, &deepClone))
            {
                m_clonedObjects->Add(src, *dst);

                if (deepClone == SCADeepCloneType::Map)
                {
                    m_cloner->CloneMap(src, *dst);
                    deepClone = SCADeepCloneType::Object;
                }
                else if (deepClone == SCADeepCloneType::Set)
                {
                    m_cloner->CloneSet(src, *dst);
                    deepClone = SCADeepCloneType::Object;
                }

                if (deepClone == SCADeepCloneType::HostObject)
                {
                    m_cloner->CloneHostObjectProperties(typeId, src, *dst);
                }
                else if (deepClone == SCADeepCloneType::Object)
                {
                    m_cloner->CloneProperties(typeId, src, *dst);
                }
                return;
            }

            // Unsupported src type, throw
            m_cloner->ThrowSCAUnsupported();
        }